

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O3

ON_XMLNode * __thiscall ON_PostEffects::CImpl::PostEffectsNode(CImpl *this)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  undefined4 extraout_var;
  ON_XMLRootNode *pOVar3;
  
  pOVar2 = ON_InternalXMLImpl::Node(&this->super_ON_InternalXMLImpl);
  iVar1 = (*pOVar2->_vptr_ON_XMLNode[0x2a])
                    (pOVar2,L"render-content-manager-document/settings/post-effects-new");
  pOVar3 = (ON_XMLRootNode *)CONCAT44(extraout_var,iVar1);
  if (pOVar3 == (ON_XMLRootNode *)0x0) {
    ON_REMOVE_ASAP_AssertEx
              (0,
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_post_effects.cpp"
               ,0x1d8,"","false is false");
    pOVar3 = &g_panic_node;
  }
  return &pOVar3->super_ON_XMLNode;
}

Assistant:

ON_XMLNode& ON_PostEffects::CImpl::PostEffectsNode(void) const
{
  ON_XMLNode* post_effects_node = Node().CreateNodeAtPath(XMLPathPeps());
  if (nullptr != post_effects_node)
    return *post_effects_node;

  // Should never get here.
  ON_ASSERT(false);
  return g_panic_node;
}